

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<BasicContext>::disposeImpl(HeapDisposer<BasicContext> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<BasicContext> *this_local;
  
  if (pointer != (void *)0x0) {
    setupAsyncIo::BasicContext::~BasicContext((BasicContext *)pointer);
    operator_delete(pointer,400);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }